

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_FilesDeletedAfterCompaction_Test::~DBTest_FilesDeletedAfterCompaction_Test
          (DBTest_FilesDeletedAfterCompaction_Test *this)

{
  DBTest_FilesDeletedAfterCompaction_Test *this_local;
  
  ~DBTest_FilesDeletedAfterCompaction_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, FilesDeletedAfterCompaction) {
  ASSERT_LEVELDB_OK(Put("foo", "v2"));
  Compact("a", "z");
  const int num_files = CountFiles();
  for (int i = 0; i < 10; i++) {
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    Compact("a", "z");
  }
  ASSERT_EQ(CountFiles(), num_files);
}